

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::SSLClient::connect_with_proxy
          (SSLClient *this,Socket *socket,Response *res,bool *success,Error *error)

{
  socket_t sVar1;
  time_t tVar2;
  time_t tVar3;
  time_t tVar4;
  time_t tVar5;
  bool bVar6;
  anon_class_32_4_86ec7540 local_300;
  function<bool_(httplib::Stream_&)> local_2e0;
  undefined1 local_2c0 [8];
  Response res3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  auth;
  anon_class_24_3_cc83523b local_178;
  function<bool_(httplib::Stream_&)> local_160;
  undefined1 local_140 [8];
  Response res2;
  Error *error_local;
  bool *success_local;
  Response *res_local;
  Socket *socket_local;
  SSLClient *this_local;
  
  *success = true;
  res2._256_8_ = error;
  Response::Response((Response *)local_140);
  sVar1 = socket->sock;
  tVar2 = (this->super_ClientImpl).read_timeout_sec_;
  tVar3 = (this->super_ClientImpl).read_timeout_usec_;
  tVar4 = (this->super_ClientImpl).write_timeout_sec_;
  tVar5 = (this->super_ClientImpl).write_timeout_usec_;
  local_178.error = (Error *)res2._256_8_;
  local_178.this = this;
  local_178.res2 = (Response *)local_140;
  std::function<bool(httplib::Stream&)>::
  function<httplib::SSLClient::connect_with_proxy(httplib::ClientImpl::Socket&,httplib::Response&,bool&,httplib::Error&)::_lambda(httplib::Stream&)_1_,void>
            ((function<bool(httplib::Stream&)> *)&local_160,&local_178);
  bVar6 = detail::process_client_socket(sVar1,tVar2,tVar3,tVar4,tVar5,&local_160);
  std::function<bool_(httplib::Stream_&)>::~function(&local_160);
  if (((bVar6 ^ 0xffU) & 1) != 0) {
    (*(this->super_ClientImpl)._vptr_ClientImpl[4])(this,socket,1);
    ClientImpl::shutdown_socket(&this->super_ClientImpl,socket);
    ClientImpl::close_socket(&this->super_ClientImpl,socket);
    *success = false;
    this_local._7_1_ = 0;
    goto LAB_0018cb75;
  }
  if (res2.version.field_2._8_4_ == 0x197) {
    bVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&(this->super_ClientImpl).proxy_digest_auth_username_);
    if ((bVar6) ||
       (bVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty(&(this->super_ClientImpl).proxy_digest_auth_password_), bVar6)) {
      Response::operator=(res,(Response *)local_140);
      this_local._7_1_ = 0;
      goto LAB_0018cb75;
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&res3.is_chunked_content_provider_);
    bVar6 = detail::parse_www_authenticate
                      ((Response *)local_140,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&res3.is_chunked_content_provider_,true);
    if (bVar6) {
      Response::Response((Response *)local_2c0);
      sVar1 = socket->sock;
      tVar2 = (this->super_ClientImpl).read_timeout_sec_;
      tVar3 = (this->super_ClientImpl).read_timeout_usec_;
      tVar4 = (this->super_ClientImpl).write_timeout_sec_;
      tVar5 = (this->super_ClientImpl).write_timeout_usec_;
      local_300.auth =
           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&res3.is_chunked_content_provider_;
      local_300.error = (Error *)res2._256_8_;
      local_300.this = this;
      local_300.res3 = (Response *)local_2c0;
      std::function<bool(httplib::Stream&)>::
      function<httplib::SSLClient::connect_with_proxy(httplib::ClientImpl::Socket&,httplib::Response&,bool&,httplib::Error&)::_lambda(httplib::Stream&)_2_,void>
                ((function<bool(httplib::Stream&)> *)&local_2e0,&local_300);
      bVar6 = detail::process_client_socket(sVar1,tVar2,tVar3,tVar4,tVar5,&local_2e0);
      std::function<bool_(httplib::Stream_&)>::~function(&local_2e0);
      bVar6 = ((bVar6 ^ 0xffU) & 1) != 0;
      if (bVar6) {
        (*(this->super_ClientImpl)._vptr_ClientImpl[4])(this,socket,1);
        ClientImpl::shutdown_socket(&this->super_ClientImpl,socket);
        ClientImpl::close_socket(&this->super_ClientImpl,socket);
        *success = false;
        this_local._7_1_ = 0;
      }
      Response::~Response((Response *)local_2c0);
      if (!bVar6) goto LAB_0018cb11;
    }
    else {
LAB_0018cb11:
      bVar6 = false;
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&res3.is_chunked_content_provider_);
    if (bVar6) goto LAB_0018cb75;
  }
  this_local._7_1_ = 1;
LAB_0018cb75:
  Response::~Response((Response *)local_140);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool SSLClient::connect_with_proxy(Socket &socket, Response &res,
                                          bool &success, Error &error) {
  success = true;
  Response res2;
  if (!detail::process_client_socket(
          socket.sock, read_timeout_sec_, read_timeout_usec_,
          write_timeout_sec_, write_timeout_usec_, [&](Stream &strm) {
            Request req2;
            req2.method = "CONNECT";
            req2.path = host_and_port_;
            return process_request(strm, req2, res2, false, error);
          })) {
    // Thread-safe to close everything because we are assuming there are no
    // requests in flight
    shutdown_ssl(socket, true);
    shutdown_socket(socket);
    close_socket(socket);
    success = false;
    return false;
  }

  if (res2.status == 407) {
    if (!proxy_digest_auth_username_.empty() &&
        !proxy_digest_auth_password_.empty()) {
      std::map<std::string, std::string> auth;
      if (detail::parse_www_authenticate(res2, auth, true)) {
        Response res3;
        if (!detail::process_client_socket(
                socket.sock, read_timeout_sec_, read_timeout_usec_,
                write_timeout_sec_, write_timeout_usec_, [&](Stream &strm) {
                  Request req3;
                  req3.method = "CONNECT";
                  req3.path = host_and_port_;
                  req3.headers.insert(detail::make_digest_authentication_header(
                      req3, auth, 1, detail::random_string(10),
                      proxy_digest_auth_username_, proxy_digest_auth_password_,
                      true));
                  return process_request(strm, req3, res3, false, error);
                })) {
          // Thread-safe to close everything because we are assuming there are
          // no requests in flight
          shutdown_ssl(socket, true);
          shutdown_socket(socket);
          close_socket(socket);
          success = false;
          return false;
        }
      }
    } else {
      res = res2;
      return false;
    }
  }

  return true;
}